

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::checkCoreFile(exr_context_t f,bool reduceMemory,bool reduceTime)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  pointer puVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  undefined7 in_register_00000031;
  size_type sVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  int32_t curtw;
  int32_t lines_per_chunk;
  exr_storage_t store;
  int32_t curth;
  int numparts;
  int32_t levh;
  int32_t levw;
  int32_t levelsy;
  int32_t levelsx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imgdata;
  exr_attr_box2i_t datawin;
  exr_tile_round_mode_t roundingmode;
  exr_tile_level_mode_t levelmode;
  uint32_t tysz;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  uint local_2c8;
  int local_2c4;
  undefined4 local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  ulong local_288;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  long local_270;
  undefined1 local_264 [4];
  undefined1 local_260 [4];
  undefined1 local_25c [4];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  long local_210;
  short local_208;
  
  iVar3 = exr_get_count(f,&local_2bc);
  bVar20 = true;
  if (iVar3 == 0) {
    iVar3 = 0;
    if (0 < local_2bc) {
      local_2c0 = (undefined4)CONCAT71(in_register_00000031,reduceMemory);
      do {
        iVar4 = exr_get_storage(f,iVar3,&local_2c8);
        if (iVar4 != 0) {
          return true;
        }
        if ((local_2c8 & 0xfffffffe) != 2) {
          if (local_2c8 == 1) {
            iVar4 = exr_get_data_window(f,iVar3,&local_280);
            if (iVar4 != 0) {
              return true;
            }
            iVar4 = exr_get_tile_descriptor(f,iVar3,&local_2cc,local_25c,local_260,local_264);
            if (iVar4 != 0) {
              return true;
            }
            iVar4 = exr_get_tile_levels(f,iVar3,&local_2ac,&local_2b0);
            if (iVar4 != 0) {
              return true;
            }
            if (0 < local_2b0) {
              bVar20 = true;
              iVar4 = 0;
              local_2d0 = 0;
              iVar7 = local_2b0;
              iVar5 = local_2ac;
              do {
                if ((bVar20) && (0 < iVar5)) {
                  iVar11 = 0;
                  do {
                    iVar5 = local_2d0;
                    iVar4 = exr_get_level_sizes(f,iVar3,iVar11,local_2d0,&local_2b4,&local_2b8);
                    local_288 = CONCAT44(local_288._4_4_,iVar11);
                    iVar7 = local_2d0;
                    if ((iVar4 == 0) &&
                       (iVar4 = exr_get_tile_sizes(f,iVar3,iVar11,iVar5,&local_2d4,&local_2c4),
                       iVar7 = iVar5, iVar4 == 0)) {
                      local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      iVar4 = 0;
                      memset(&local_210,0,0x1e0);
                      if ((bool)(0 < local_2b8 & bVar20)) {
                        iVar4 = 0;
                        lVar15 = 0;
                        iVar10 = 0;
                        bVar14 = false;
                        iVar11 = local_2b8;
                        do {
                          local_270 = lVar15;
                          if ((bVar20) && (0 < local_2b4)) {
                            lVar15 = 0;
                            iVar18 = 0;
                            do {
                              iVar4 = exr_read_tile_chunk_info
                                                (f,iVar3,iVar18,iVar10,local_288 & 0xffffffff,iVar5,
                                                 &local_258);
                              if (iVar4 == 0) {
                                if (local_210 == 0) {
                                  iVar4 = exr_decoding_initialize(f,iVar3,&local_258);
                                  if (iVar4 != 0) goto LAB_00111d94;
                                  if (local_208 < 1) {
                                    sVar12 = 0;
LAB_00111cc4:
                                    bVar14 = true;
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_2a8,sVar12);
                                  }
                                  else {
                                    lVar17 = 0x28;
                                    lVar19 = 0;
                                    sVar12 = 0;
                                    do {
                                      *(size_type *)(local_210 + lVar17) = sVar12 + 0x1000;
                                      sVar1 = *(short *)(local_210 + -0xc + lVar17);
                                      *(int *)(local_210 + -8 + lVar17) = (int)sVar1;
                                      *(int *)(local_210 + -4 + lVar17) = local_2d4 * sVar1;
                                      sVar12 = (long)local_2c4 * (long)local_2d4 * (long)sVar1 +
                                               sVar12;
                                      lVar19 = lVar19 + 1;
                                      lVar17 = lVar17 + 0x30;
                                    } while (lVar19 < local_208);
                                    if (((char)local_2c0 == '\0') || (sVar12 < 1000000))
                                    goto LAB_00111cc4;
                                    bVar14 = false;
                                  }
                                  iVar4 = exr_decoding_choose_default_routines(f,iVar3,&local_210);
                                  if (iVar4 != 0) goto LAB_00111d94;
                                }
                                else {
                                  iVar4 = exr_decoding_update(f,iVar3,&local_258,&local_210);
                                  if (iVar4 != 0) goto LAB_00111bbe;
                                }
                                iVar4 = 0;
                                bVar2 = false;
                                if (bVar14) {
                                  if (0 < local_208) {
                                    lVar17 = 0x28;
                                    lVar19 = 0;
                                    puVar8 = local_2a8.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                    do {
                                      *(pointer *)(local_210 + lVar17) = puVar8;
                                      sVar1 = *(short *)(local_210 + -0xc + lVar17);
                                      *(int *)(local_210 + -8 + lVar17) = (int)sVar1;
                                      *(int *)(local_210 + -4 + lVar17) = local_2d4 * sVar1;
                                      puVar8 = puVar8 + (long)local_2c4 * (long)local_2d4 *
                                                        (long)sVar1;
                                      lVar19 = lVar19 + 1;
                                      lVar17 = lVar17 + 0x30;
                                    } while (lVar19 < local_208);
                                  }
                                  iVar4 = exr_decoding_run(f,iVar3,&local_210);
                                  bVar14 = true;
                                  bVar2 = bVar14;
                                  if (reduceTime && iVar4 != 0) goto LAB_00111d94;
                                }
                              }
                              else {
LAB_00111bbe:
                                bVar2 = bVar14;
                                if (reduceTime) {
LAB_00111d94:
                                  bVar20 = false;
                                  iVar11 = local_2b8;
                                  break;
                                }
                              }
                              bVar14 = bVar2;
                              lVar15 = lVar15 + local_2d4;
                              iVar18 = iVar18 + 1;
                              iVar11 = local_2b8;
                            } while (lVar15 < local_2b4);
                          }
                          if (!bVar20) break;
                          lVar15 = local_270 + local_2c4;
                          iVar10 = iVar10 + 1;
                        } while (lVar15 < iVar11);
                      }
                      exr_decoding_destroy(f,&local_210);
                      if (local_2a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_2a8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_2a8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_2a8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    else if (reduceTime) {
                      return true;
                    }
                    local_2d0 = iVar7;
                    iVar7 = local_2b0;
                    iVar5 = local_2ac;
                  } while ((bVar20) && (iVar11 = (int)local_288 + 1, iVar11 < local_2ac));
                }
              } while ((bVar20) && (local_2d0 = local_2d0 + 1, local_2d0 < iVar7));
              if (iVar4 != 0) {
                return true;
              }
            }
          }
          else if (local_2c8 == 0) {
            iVar4 = exr_get_data_window(f,iVar3,&local_280);
            if (iVar4 != 0) {
              return true;
            }
            lVar17 = (long)local_278;
            local_288 = (ulong)local_280;
            lVar19 = (long)local_274;
            lVar15 = (long)local_27c;
            local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            memset(&local_210,0,0x1e0);
            iVar4 = exr_get_scanlines_per_chunk(f,iVar3,&local_2cc);
            bVar20 = true;
            if (iVar4 == 0) {
              iVar4 = 0;
              if (lVar19 + 1 != lVar15) {
                lVar17 = (lVar17 - local_288) + 1;
                uVar16 = 0;
                bVar20 = false;
                do {
                  local_228 = 0;
                  uStack_220 = 0;
                  local_238 = 0;
                  uStack_230 = 0;
                  local_248 = 0;
                  uStack_240 = 0;
                  local_258 = 0;
                  uStack_250 = 0;
                  iVar4 = exr_read_scanline_chunk_info(f,iVar3,local_27c + (int)uVar16,&local_258);
                  if (iVar4 == 0) {
                    if (local_210 == 0) {
                      iVar4 = exr_decoding_initialize(f,iVar3,&local_258);
                      if (iVar4 != 0) goto LAB_00111e4d;
                      if (local_208 < 1) {
                        sVar12 = 0;
LAB_00111941:
                        bVar20 = true;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_2a8,sVar12);
                      }
                      else {
                        lVar6 = 0x28;
                        lVar9 = 0;
                        sVar12 = 0;
                        do {
                          *(undefined8 *)(local_210 + lVar6) = 0x1000;
                          sVar1 = *(short *)(local_210 + -0xc + lVar6);
                          *(int *)(local_210 + -8 + lVar6) = (int)sVar1;
                          lVar13 = sVar1 * lVar17;
                          *(int *)(local_210 + -4 + lVar6) = (int)lVar13;
                          sVar12 = sVar12 + local_2cc * lVar13;
                          lVar9 = lVar9 + 1;
                          lVar6 = lVar6 + 0x30;
                        } while (lVar9 < local_208);
                        if (((char)local_2c0 == '\0') || (sVar12 < 8000000)) goto LAB_00111941;
                        bVar20 = false;
                      }
                      iVar4 = exr_decoding_choose_default_routines(f,iVar3,&local_210);
                      if (iVar4 != 0) break;
                    }
                    else {
                      iVar4 = exr_decoding_update(f,iVar3,&local_258,&local_210);
                      if (iVar4 != 0) goto LAB_0011185b;
                    }
                    iVar4 = 0;
                    bVar14 = false;
                    if (bVar20) {
                      if (0 < local_208) {
                        lVar6 = 0x28;
                        lVar9 = 0;
                        puVar8 = local_2a8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        do {
                          *(pointer *)(local_210 + lVar6) = puVar8;
                          sVar1 = *(short *)(local_210 + -0xc + lVar6);
                          *(int *)(local_210 + -8 + lVar6) = (int)sVar1;
                          lVar13 = sVar1 * lVar17;
                          *(int *)(local_210 + -4 + lVar6) = (int)lVar13;
                          puVar8 = puVar8 + local_2cc * lVar13;
                          lVar9 = lVar9 + 1;
                          lVar6 = lVar6 + 0x30;
                        } while (lVar9 < local_208);
                      }
                      iVar4 = exr_decoding_run(f,iVar3,&local_210);
                      bVar14 = true;
                      if (reduceTime && iVar4 != 0) break;
                    }
                  }
                  else {
LAB_0011185b:
                    bVar14 = bVar20;
                    if (reduceTime) {
LAB_00111e4d:
                      iVar4 = 1;
                      break;
                    }
                  }
                  uVar16 = uVar16 + (long)local_2cc;
                  bVar20 = bVar14;
                } while (uVar16 < (ulong)((lVar19 + 1) - lVar15));
              }
              exr_decoding_destroy(f,&local_210);
              bVar20 = iVar4 != 0;
            }
            if (local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar20) {
              return true;
            }
          }
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_2bc);
    }
    bVar20 = false;
  }
  return bVar20;
}

Assistant:

bool
checkCoreFile (exr_context_t f, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv;
    int          numparts;

    rv = exr_get_count (f, &numparts);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (int p = 0; p < numparts; ++p)
    {
        exr_storage_t store;
        rv = exr_get_storage (f, p, &store);
        if (rv != EXR_ERR_SUCCESS) return true;

        // TODO: Need to fill this in
        if (store == EXR_STORAGE_DEEP_SCANLINE ||
            store == EXR_STORAGE_DEEP_TILED)
            continue;

        if (store == EXR_STORAGE_SCANLINE)
        {
            if (readCoreScanlinePart (f, p, reduceMemory, reduceTime))
                return true;
        }
        else if (store == EXR_STORAGE_TILED)
        {
            if (readCoreTiledPart (f, p, reduceMemory, reduceTime)) return true;
        }
    }

    return false;
}